

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hwpq_test.cpp
# Opt level: O0

int32_t main(int argc,char **argv)

{
  int iVar1;
  long lVar2;
  int32_t local_270;
  int local_26c;
  int ret;
  int i;
  VdppTestMultiCtxInfo *ctxs;
  VdppCmdCfg *p_cmd_cfg;
  VdppCmdCfg vdpp_cmd_cfg;
  char **argv_local;
  int argc_local;
  
  vdpp_cmd_cfg._568_8_ = argv;
  parse_cmd(argv,argc,(VdppCmdCfg *)&p_cmd_cfg);
  lVar2 = mpp_osal_calloc("main",(long)(int)vdpp_cmd_cfg.img_h_o_c_vir * 0x48);
  if (lVar2 == 0) {
    _mpp_log_l(2,"hwpq_test","failed to alloc context for instances\n",0);
    local_270 = -4;
  }
  else {
    for (local_26c = 0; local_270 = 0, local_26c < (int)vdpp_cmd_cfg.img_h_o_c_vir;
        local_26c = local_26c + 1) {
      *(VdppCmdCfg **)(lVar2 + (long)local_26c * 0x48) = (VdppCmdCfg *)&p_cmd_cfg;
      *(int *)(lVar2 + (long)local_26c * 0x48 + 8) = local_26c;
      iVar1 = pthread_create((pthread_t *)(lVar2 + (long)local_26c * 0x48 + 0x10),
                             (pthread_attr_t *)0x0,multi_vdpp,
                             (void *)(lVar2 + (long)local_26c * 0x48));
      if (iVar1 != 0) {
        _mpp_log_l(2,"hwpq_test","failed to create thread %d\n",0,local_26c);
        local_270 = -1;
        goto LAB_001024be;
      }
    }
    for (local_26c = 0; local_26c < (int)vdpp_cmd_cfg.img_h_o_c_vir; local_26c = local_26c + 1) {
      pthread_join(*(pthread_t *)(lVar2 + (long)local_26c * 0x48 + 0x10),(void **)0x0);
    }
  }
LAB_001024be:
  if (lVar2 != 0) {
    mpp_osal_free("main",lVar2);
  }
  return local_270;
}

Assistant:

int32_t main(int argc, char **argv)
{
    VdppCmdCfg vdpp_cmd_cfg;
    VdppCmdCfg *p_cmd_cfg = &vdpp_cmd_cfg;
    VdppTestMultiCtxInfo *ctxs = NULL;
    int i = 0;
    int ret = 0;

    parse_cmd(argv, argc, p_cmd_cfg);

    ctxs = mpp_calloc(VdppTestMultiCtxInfo, p_cmd_cfg->nthreads);
    if (NULL == ctxs) {
        mpp_err("failed to alloc context for instances\n");
        ret = MPP_ERR_MALLOC;
        goto __RET;
    }

    for (i = 0; i < p_cmd_cfg->nthreads; i++) {
        ctxs[i].cmd = p_cmd_cfg;
        ctxs[i].chn = i;

        ret = pthread_create(&ctxs[i].thd, NULL, multi_vdpp, &ctxs[i]);
        if (ret) {
            mpp_err("failed to create thread %d\n", i);
            ret = MPP_NOK;
            goto __RET;
        }
    }

    for (i = 0; i < p_cmd_cfg->nthreads; i++)
        pthread_join(ctxs[i].thd, NULL);

__RET:
    MPP_FREE(ctxs);
    ctxs = NULL;

    return ret;
}